

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DensityHistogram.cpp
# Opt level: O0

void __thiscall
OpenMD::DensityHistogram::DensityHistogram
          (DensityHistogram *this,SimInfo *info,string *filename,string *sele,int nbins)

{
  undefined1 uVar1;
  string *in_RCX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  SimInfo *in_stack_00000028;
  SelectionEvaluator *in_stack_00000030;
  SimInfo *in_stack_000001d8;
  SelectionManager *in_stack_000001e0;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  StaticAnalyser *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  StaticAnalyser *in_stack_ffffffffffffff40;
  SelectionManager *this_00;
  SelectionEvaluator *this_01;
  string local_90 [8];
  string *in_stack_ffffffffffffff78;
  SelectionEvaluator *in_stack_ffffffffffffff80;
  string local_70 [76];
  undefined4 local_24;
  string *local_20;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_ffffffffffffff40,
             (SimInfo *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
             (string *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  *in_RDI = &PTR__DensityHistogram_005606d8;
  this_01 = (SelectionEvaluator *)(in_RDI + 0x1b);
  std::__cxx11::string::string((string *)this_01,local_20);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000030,in_stack_00000028);
  SelectionManager::SelectionManager(in_stack_000001e0,in_stack_000001d8);
  *(undefined4 *)(in_RDI + 0xe2) = local_24;
  this_00 = (SelectionManager *)(in_RDI + 0xe4);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1f78d5);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1f78eb);
  SelectionEvaluator::loadScriptString(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
  if (!(bool)uVar1) {
    in_stack_ffffffffffffff30 = (StaticAnalyser *)(in_RDI + 0xc9);
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              (this_00,(SelectionSet *)CONCAT17(uVar1,in_stack_ffffffffffffff38));
    SelectionSet::~SelectionSet((SelectionSet *)0x1f7975);
  }
  getPrefix((string *)CONCAT17(uVar1,in_stack_ffffffffffffff38));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff38),(char *)in_stack_ffffffffffffff30);
  StaticAnalyser::setOutputName
            (in_stack_ffffffffffffff30,
             (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

DensityHistogram::DensityHistogram(SimInfo* info, const std::string& filename,
                                     const std::string& sele, int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info), nBins_(nbins) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    setOutputName(getPrefix(filename) + ".EAMDensity");
  }